

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_> * __thiscall
cfd::core::
JsonObjectVector<cfd::api::json::DecodeRawTransactionTxIn,_DecodeRawTransactionTxInStruct>::
ConvertToStruct(vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
                *__return_storage_ptr__,
               JsonObjectVector<cfd::api::json::DecodeRawTransactionTxIn,_DecodeRawTransactionTxInStruct>
               *this)

{
  pointer pDVar1;
  pointer this_00;
  DecodeRawTransactionTxInStruct data;
  DecodeRawTransactionTxInStruct DStack_128;
  
  (__return_storage_ptr__->
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pDVar1 = (this->super_JsonVector<cfd::api::json::DecodeRawTransactionTxIn>).
           super_vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
           .
           super__Vector_base<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->super_JsonVector<cfd::api::json::DecodeRawTransactionTxIn>).
                 super_vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
                 .
                 super__Vector_base<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pDVar1; this_00 = this_00 + 1
      ) {
    api::json::DecodeRawTransactionTxIn::ConvertToStruct(&DStack_128,this_00);
    std::vector<DecodeRawTransactionTxInStruct,_std::allocator<DecodeRawTransactionTxInStruct>_>::
    push_back(__return_storage_ptr__,&DStack_128);
    DecodeRawTransactionTxInStruct::~DecodeRawTransactionTxInStruct(&DStack_128);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }